

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void qt_rectfill_quint64(QRasterBuffer *rasterBuffer,int x,int y,int width,int height,QRgba64 *color
                        )

{
  uchar *puVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  QRasterBuffer *in_RDI;
  undefined4 in_R8D;
  QRgba64 *in_R9;
  long in_FS_OFFSET;
  ConvertAndStorePixelsFunc64 store;
  quint64 c64;
  undefined1 *puVar2;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  (*qStoreFromRGBA64PM[in_RDI->format])
            ((uchar *)&local_10,in_R9,0,1,(QList<unsigned_int> *)0x0,(QDitherInfo *)0x0);
  puVar1 = QRasterBuffer::buffer(in_RDI);
  puVar2 = local_10;
  QRasterBuffer::bytesPerLine(in_RDI);
  qt_rectfill<unsigned_long_long>
            ((unsigned_long_long *)CONCAT44(in_R8D,in_ECX),CONCAT44(in_EDX,in_ESI),
             (int)((ulong)puVar2 >> 0x20),(int)puVar2,(int)((ulong)puVar1 >> 0x20),(int)puVar1,
             (qsizetype)in_R9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void qt_rectfill_quint64(QRasterBuffer *rasterBuffer,
                                int x, int y, int width, int height,
                                const QRgba64 &color)
{
    const auto store = qStoreFromRGBA64PM[rasterBuffer->format];
    quint64 c64;
    store(reinterpret_cast<uchar *>(&c64), &color, 0, 1, nullptr, nullptr);
    qt_rectfill<quint64>(reinterpret_cast<quint64 *>(rasterBuffer->buffer()),
                         c64, x, y, width, height, rasterBuffer->bytesPerLine());
}